

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O1

_InputArray * __thiscall
imgviz::tile(imgviz *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *images,Vec2i *shape,
            uint border_width,Scalar *border_color)

{
  double dVar1;
  uint uVar2;
  pointer pMVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  Mat *dst;
  Mat image;
  Mat border;
  Mat dst_row;
  uint local_2ec;
  uint local_2e8;
  _InputArray local_2e0;
  _InputArray *local_2c8;
  long local_2c0;
  _InputArray local_2b8;
  Scalar *local_2a0;
  ulong local_298;
  long local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_270;
  _InputArray local_268 [4];
  _OutputArray local_208;
  undefined1 local_1f0 [16];
  Size local_1e0;
  Mat local_180 [96];
  Mat local_120 [144];
  _InputArray local_90 [4];
  
  iVar8 = (int)border_color;
  pMVar3 = (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_2e8 = *(uint *)(pMVar3 + 8);
  local_2ec = *(uint *)(pMVar3 + 0xc);
  uVar9 = ((long)(images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar3 >> 5) * -0x5555555555555555;
  if (1 < uVar9) {
    lVar4 = uVar9 - 1;
    pMVar3 = pMVar3 + 0x6c;
    do {
      if (local_2e8 < *(uint *)(pMVar3 + -4)) {
        local_2e8 = *(uint *)(pMVar3 + -4);
      }
      if (local_2ec < *(uint *)pMVar3) {
        local_2ec = *(uint *)pMVar3;
      }
      pMVar3 = pMVar3 + 0x60;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  local_2c8 = (_InputArray *)this;
  local_2a0 = border_color;
  local_270 = images;
  if ((shape->super_Matx<int,_2,_1>).val[1] == 0 || (shape->super_Matx<int,_2,_1>).val[0] == 0) {
    dVar1 = (double)(uVar9 & 0xffffffff) / ((double)local_2e8 / (double)local_2ec);
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar1 = round(dVar1);
    uVar5 = (ulong)dVar1;
    uVar6 = -(int)uVar5;
    uVar2 = 0xffffffff;
    do {
      uVar2 = uVar2 + 1;
      uVar6 = uVar6 + (int)uVar5;
    } while (uVar6 < (uint)uVar9);
    do {
      uVar7 = uVar5 & 0xffffffff;
      uVar6 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar6;
    } while ((uint)uVar9 <= uVar6 * uVar2);
    *(ulong *)(shape->super_Matx<int,_2,_1>).val = uVar7 | (ulong)uVar2 << 0x20;
  }
  uVar5 = (ulong)(uint)(shape->super_Matx<int,_2,_1>).val[0];
  uVar9 = (ulong)(uint)(shape->super_Matx<int,_2,_1>).val[1];
  cv::Mat::Mat((Mat *)local_2c8);
  if (uVar5 != 0) {
    local_288 = uVar9 * 0x60;
    local_290 = 0;
    local_2c0 = 0;
    local_278 = 0;
    local_298 = uVar9;
    local_280 = uVar5;
    do {
      cv::Mat::Mat((Mat *)local_90);
      if ((int)uVar9 != 0) {
        uVar5 = 0;
        lVar4 = local_2c0;
        do {
          uVar9 = local_290 + uVar5;
          cv::Mat::Mat((Mat *)local_268);
          pMVar3 = (local_270->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar9 < (ulong)(((long)(local_270->
                                     super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pMVar3 >> 5) *
                             -0x5555555555555555)) {
            cv::Mat::operator=((Mat *)local_268,pMVar3 + lVar4);
            uVar9 = local_298;
            local_2e0.flags = local_2ec;
            local_2e0._4_4_ = local_2e8;
            centerize((imgviz *)local_1f0,(Mat *)local_268,(Size *)&local_2e0);
            cv::Mat::operator=((Mat *)local_268,(Mat *)local_1f0);
            cv::Mat::~Mat((Mat *)local_1f0);
          }
          else {
            cv::Mat::zeros((int)local_1f0,local_2e8,local_2ec);
            (**(code **)(*(long *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_) + 0x18))
                      ((long *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_),local_1f0,local_268);
            cv::Mat::~Mat(local_120);
            cv::Mat::~Mat(local_180);
            cv::Mat::~Mat((Mat *)(local_1f0 + 0x10));
            uVar9 = local_298;
          }
          if ((local_268[0].flags & 0xfffU) == 0) {
            local_1e0.width = 0;
            local_1e0.height = 0;
            local_1f0._0_4_ = 0x1010000;
            local_2e0.sz.width = 0;
            local_2e0.sz.height = 0;
            local_2e0.flags = 0x2010000;
            local_2e0.obj = local_268;
            local_1f0._8_8_ = local_268;
            cv::cvtColor((cv *)local_1f0,&local_2e0,(_OutputArray *)0x8,0,iVar8);
          }
          if ((local_268[0].flags & 0xfffU) != 0x10) {
            __assert_fail("image.type() == CV_8UC3",
                          "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                          ,0xa8,
                          "cv::Mat imgviz::tile(const std::vector<cv::Mat>, cv::Vec2i, const unsigned int, const cv::Scalar)"
                         );
          }
          if (uVar5 == 0) {
            cv::Mat::operator=((Mat *)local_90,(Mat *)local_268);
          }
          else {
            if (border_width != 0) {
              cv::Mat::Mat((Mat *)local_1f0,(int)local_90[0].obj,border_width,0x10);
              local_2e0.flags = -0x3efdfffa;
              local_2e0.obj = local_2a0;
              local_2e0.sz.width = 1;
              local_2e0.sz.height = 4;
              cv::noArray();
              cv::Mat::setTo((_InputArray *)local_1f0,&local_2e0);
              local_2e0.sz.width = 0;
              local_2e0.sz.height = 0;
              local_2e0.flags = 0x1010000;
              local_2b8.sz.width = 0;
              local_2b8.sz.height = 0;
              local_2b8.flags = 0x1010000;
              local_208.super__InputArray.sz.width = 0;
              local_208.super__InputArray.sz.height = 0;
              local_208.super__InputArray.flags = 0x2010000;
              local_2e0.obj = local_90;
              local_2b8.obj = (_InputArray *)local_1f0;
              local_208.super__InputArray.obj = local_90;
              cv::hconcat(&local_2e0,&local_2b8,&local_208);
              cv::Mat::~Mat((Mat *)local_1f0);
            }
            local_1e0.width = 0;
            local_1e0.height = 0;
            local_1f0._0_4_ = 0x1010000;
            local_2e0.sz.width = 0;
            local_2e0.sz.height = 0;
            local_2e0.flags = 0x1010000;
            local_2e0.obj = local_268;
            local_2b8.sz.width = 0;
            local_2b8.sz.height = 0;
            local_2b8.flags = 0x2010000;
            local_2b8.obj = local_90;
            local_1f0._8_8_ = local_90;
            cv::hconcat((_InputArray *)local_1f0,&local_2e0,(_OutputArray *)&local_2b8);
          }
          cv::Mat::~Mat((Mat *)local_268);
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x60;
        } while (uVar9 != uVar5);
      }
      uVar5 = local_278;
      if (local_278 == 0) {
        cv::Mat::operator=((Mat *)local_2c8,(Mat *)local_90);
      }
      else {
        if (border_width != 0) {
          cv::Mat::Mat((Mat *)local_1f0,border_width,*(int *)((long)&local_2c8->obj + 4),0x10);
          local_268[0].flags = -0x3efdfffa;
          local_268[0].obj = local_2a0;
          local_268[0].sz.width = 1;
          local_268[0].sz.height = 4;
          cv::noArray();
          cv::Mat::setTo((_InputArray *)local_1f0,local_268);
          local_268[0].sz.width = 0;
          local_268[0].sz.height = 0;
          local_268[0].flags = 0x1010000;
          local_268[0].obj = local_2c8;
          local_2e0.sz.width = 0;
          local_2e0.sz.height = 0;
          local_2e0.flags = 0x1010000;
          local_2b8.sz.width = 0;
          local_2b8.sz.height = 0;
          local_2b8.flags = 0x2010000;
          local_2b8.obj = local_2c8;
          local_2e0.obj = (_InputArray *)local_1f0;
          cv::vconcat(local_268,&local_2e0,(_OutputArray *)&local_2b8);
          cv::Mat::~Mat((Mat *)local_1f0);
        }
        local_1e0.width = 0;
        local_1e0.height = 0;
        local_1f0._0_4_ = 0x1010000;
        local_1f0._8_8_ = local_2c8;
        local_268[0].sz.width = 0;
        local_268[0].sz.height = 0;
        local_268[0].flags = 0x1010000;
        local_2e0.sz.width = 0;
        local_2e0.sz.height = 0;
        local_2e0.flags = 0x2010000;
        local_2e0.obj = local_2c8;
        local_268[0].obj = local_90;
        cv::vconcat((_InputArray *)local_1f0,local_268,(_OutputArray *)&local_2e0);
      }
      cv::Mat::~Mat((Mat *)local_90);
      local_278 = uVar5 + 1;
      local_2c0 = local_2c0 + local_288;
      local_290 = local_290 + uVar9;
    } while (local_278 != local_280);
  }
  return local_2c8;
}

Assistant:

cv::Mat tile(const std::vector<cv::Mat> images,
             cv::Vec2i shape = cv::Vec2i(0, 0), const unsigned border_width = 5,
             const cv::Scalar border_color = cv::Scalar(255, 255, 255)) {
  unsigned height = images[0].rows;
  unsigned width = images[0].cols;
  for (size_t i = 1; i < images.size(); i++) {
    if (images[i].rows > height) {
      height = images[i].rows;
    }
    if (images[i].cols > width) {
      width = images[i].cols;
    }
  }

  if (shape[0] * shape[1] == 0) {
    shape = getTileShape(/*size=*/images.size(),
                         /*hw_ratio=*/static_cast<double>(height) /
                             static_cast<double>(width));
  }
  unsigned rows = shape[0];
  unsigned cols = shape[1];

  cv::Mat dst;
  for (size_t j = 0; j < rows; j++) {
    cv::Mat dst_row;
    for (size_t i = 0; i < cols; i++) {
      size_t index = j * cols + i;

      cv::Mat image;
      if (index < images.size()) {
        image = images[index];
        image = centerize(image, cv::Size(width, height));
      } else {
        image = cv::Mat::zeros(height, width, images[0].type());
      }

      if (image.type() == CV_8UC1) {
        cv::cvtColor(image, image, cv::COLOR_GRAY2BGR);
      }
      assert(image.type() == CV_8UC3);

      if (i == 0) {
        dst_row = image;
      } else {
        if (border_width != 0) {
          cv::Mat border = cv::Mat(dst_row.rows, border_width, CV_8UC3);
          border.setTo(border_color);
          cv::hconcat(dst_row, border, dst_row);
        }
        cv::hconcat(dst_row, image, dst_row);
      }
    }
    if (j == 0) {
      dst = dst_row;
    } else {
      if (border_width != 0) {
        cv::Mat border = cv::Mat(border_width, dst.cols, CV_8UC3);
        border.setTo(border_color);
        cv::vconcat(dst, border, dst);
      }
      cv::vconcat(dst, dst_row, dst);
    }
  }

  return dst;
}